

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::fail
          (HumanResults *this,NameStack *context,string *given,NameStack *whenStack,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  ostream *poVar2;
  long lVar3;
  
  writeWhenStack(this,context,given,whenStack);
  lVar3 = this->whenDepth_ + (ulong)(this->whenDepth_ == 0);
  do {
    ::std::__ostream_insert<char,std::char_traits<char>>((this->output_).value,"    ",4);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  ::std::__ostream_insert<char,std::char_traits<char>>((this->output_).value,"Then : ",7);
  _Var1._M_head_impl =
       (description->value_)._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((this->output_).value,((_Var1._M_head_impl)->_M_dataplus)._M_p,
                        (_Var1._M_head_impl)->_M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    for (lVar3 = this->whenDepth_ + (ulong)(this->whenDepth_ == 0) + 1; lVar3 != 0;
        lVar3 = lVar3 + -1) {
      ::std::__ostream_insert<char,std::char_traits<char>>((this->output_).value,"    ",4);
    }
  }
  poVar2 = (this->output_).value;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"FAILED! ",8);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(expressionText->_M_dataplus)._M_p,expressionText->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  printVariables(this,variableList);
  return;
}

Assistant:

virtual void fail(const NameStack& context,
                          const string& given,
                          const NameStack& whenStack,
                          optional<string> description,
                          const string &expressionText,
                          const vector <Variable> &variableList) override
        {
            writeWhenStack(context, given, whenStack);
            indent(whenDepth());
            (*output_) << "Then : ";

            if (description) {
                *output_ << *description << "\n";
                indent(whenDepth() + 1);
            }

            *output_ << "FAILED! " << expressionText << "\n";
            printVariables(variableList);
        }